

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_count.hpp
# Opt level: O0

void __thiscall
boost::detail::shared_count::
shared_count<std::ofstream*,boost::detail::sp_ms_deleter<std::ofstream>>(void *param_1)

{
  sp_counted_impl_pd<std::basic_ofstream<char,_std::char_traits<char>_>_*,_boost::detail::sp_ms_deleter<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  *this;
  
  *(undefined8 *)param_1 = 0;
  this = (sp_counted_impl_pd<std::basic_ofstream<char,_std::char_traits<char>_>_*,_boost::detail::sp_ms_deleter<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
          *)operator_new(0x220);
  sp_counted_impl_pd<std::basic_ofstream<char,_std::char_traits<char>_>_*,_boost::detail::sp_ms_deleter<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ::sp_counted_impl_pd(this,(basic_ofstream<char,_std::char_traits<char>_> *)param_1);
  *(sp_counted_impl_pd<std::basic_ofstream<char,_std::char_traits<char>_>_*,_boost::detail::sp_ms_deleter<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    **)param_1 = this;
  return;
}

Assistant:

id_(shared_count_id)
#endif
    {
#ifndef BOOST_NO_EXCEPTIONS

        try
        {
            pi_ = new sp_counted_impl_pd< P, D >( p );
        }
        catch( ... )
        {
            D::operator_fn( p ); // delete p
            throw;
        }

#else

        pi_ = new sp_counted_impl_pd< P, D >( p );

        if( pi_ == 0 )
        {
            D::operator_fn( p ); // delete p
            boost::throw_exception( std::bad_alloc() );
        }

#endif // #ifndef BOOST_NO_EXCEPTIONS
    }